

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::Utils::Shader::CompilationException::~CompilationException
          (CompilationException *this)

{
  ~CompilationException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~CompilationException() throw()
		{
		}